

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makecrct.c
# Opt level: O1

void write_table32hi(z_word_t *table,int k)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  
  lVar4 = 0;
  uVar6 = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    iVar2 = (SUB164(auVar1 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffff8U) * 5;
    pcVar5 = "";
    if ((lVar4 != 0) && (pcVar5 = "    ", iVar2 != (int)lVar4)) {
      pcVar5 = "";
    }
    pcVar3 = "";
    if ((lVar4 != 0x7f8) && (pcVar3 = ",\n", iVar2 + 0x20 != (int)lVar4)) {
      pcVar3 = ", ";
    }
    printf("%s0x%08x%s",pcVar5,(ulong)*(uint *)((long)table + lVar4 + 4),pcVar3);
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x800);
  return;
}

Assistant:

static void write_table32hi(const z_word_t *table, int k) {
    int n;

    for (n = 0; n < k; n++)
        printf("%s0x%08" PRIx32 "%s", n == 0 || n % 5 ? "" : "    ",
                (uint32_t)(table[n] >> 32),
                n == k - 1 ? "" : (n % 5 == 4 ? ",\n" : ", "));
}